

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<GMM_TILE_MODE_ENUM,GMM_TILE_MODE_ENUM>
          (internal *this,char *expected_expression,char *actual_expression,
          GMM_TILE_MODE_ENUM *expected,GMM_TILE_MODE_ENUM *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  long in_FS_OFFSET;
  AssertionResult AVar2;
  string local_70;
  string local_50;
  long local_30;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*expected == *actual) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_001549f5:
      __stack_chk_fail();
    }
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    PrintToString<GMM_TILE_MODE_ENUM>(&local_50,expected);
    PrintToString<GMM_TILE_MODE_ENUM>(&local_70,actual);
    AVar2 = EqFailure(this,expected_expression,actual_expression,&local_50,&local_70,false);
    sVar1 = AVar2.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      sVar1.ptr_ = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      sVar1.ptr_ = extraout_RDX_00;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_001549f5;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                const char* actual_expression,
                const T1& expected,
                const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                // signed/unsigned mismatch.
#endif

                if (expected == actual) {
                    return AssertionSuccess();
                }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

                return EqFailure(expected_expression,
                    actual_expression,
                    FormatForComparisonFailureMessage(expected, actual),
                    FormatForComparisonFailureMessage(actual, expected),
                    false);
            }